

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magic.c
# Opt level: O2

void spell_talk_to_dead(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  char *pcVar1;
  OBJ_DATA *arg1;
  char buf [4608];
  
  if (*target_name == '\0') {
    pcVar1 = "Attempt to commune with which corpse?\n\r";
  }
  else {
    pcVar1 = palloc_string(target_name);
    arg1 = get_obj_here(ch,pcVar1);
    if (arg1 == (OBJ_DATA *)0x0) {
      pcVar1 = "You can\'t find that here.\n\r";
    }
    else {
      if ((ushort)((short)*(undefined4 *)&arg1->item_type - 0x17U) < 2) {
        if ((arg1->extra_flags[0] & 0x8000000) == 0) {
          act("You draw back the spirit of the fallen and $p speaks briefly to you.",ch,arg1,
              (void *)0x0,3);
          sprintf(buf,"The spirit tells you \'I was slain by %s, now allow me my peace.\'\n\r",
                  arg1->talked);
          send_to_char(buf,ch);
          act("A faint glow surrounds $p and then fades away.",ch,arg1,(void *)0x0,0);
          return;
        }
        act("$p shudders slightly and a soft moan reaches your ears before it goes silent.",ch,arg1,
            (void *)0x0,3);
        return;
      }
      pcVar1 = "That object is not a corpse you can commune with.\n\r";
    }
  }
  send_to_char(pcVar1,ch);
  return;
}

Assistant:

void spell_talk_to_dead(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	OBJ_DATA *corpse;
	char *obj_name;
	char buf[MAX_STRING_LENGTH];

	if (target_name[0] == '\0')
	{
		send_to_char("Attempt to commune with which corpse?\n\r", ch);
		return;
	}

	obj_name = palloc_string(target_name);
	corpse = get_obj_here(ch, obj_name);

	if (corpse == nullptr)
	{
		send_to_char("You can't find that here.\n\r", ch);
		return;
	}

	if ((corpse->item_type != ITEM_CORPSE_PC) && (corpse->item_type != ITEM_CORPSE_NPC))
	{
		send_to_char("That object is not a corpse you can commune with.\n\r", ch);
		return;
	}

	if (IS_SET(corpse->extra_flags, CORPSE_NO_ANIMATE))
	{
		act("$p shudders slightly and a soft moan reaches your ears before it goes silent.", ch, corpse, 0, TO_CHAR);
		return;
	}

	act("You draw back the spirit of the fallen and $p speaks briefly to you.", ch, corpse, 0, TO_CHAR);

	sprintf(buf, "The spirit tells you 'I was slain by %s, now allow me my peace.'\n\r", corpse->talked);
	send_to_char(buf, ch);

	act("A faint glow surrounds $p and then fades away.", ch, corpse, 0, TO_ROOM);
}